

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

DescriptorNode *
cfd::core::DescriptorNode::Parse
          (DescriptorNode *__return_storage_ptr__,string *output_descriptor,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  uint32_t uVar1;
  uint uVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  allocator local_3b9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  string local_3a0;
  DescriptorScriptReference local_380;
  
  DescriptorNode(__return_storage_ptr__,network_parameters);
  __return_storage_ptr__->node_type_ = kDescriptorTypeScript;
  AnalyzeChild(__return_storage_ptr__,output_descriptor,0);
  ::std::__cxx11::string::string((string *)&local_3a0,"",(allocator *)&local_3b8);
  AnalyzeAll(__return_storage_ptr__,&local_3a0);
  ::std::__cxx11::string::~string((string *)&local_3a0);
  local_3b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = 0;
  while( true ) {
    uVar1 = GetNeedArgumentNum(__return_storage_ptr__);
    if (uVar1 <= uVar2) break;
    ::std::__cxx11::string::string((string *)&local_3a0,"0",&local_3b9);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3b8,
               &local_3a0);
    ::std::__cxx11::string::~string((string *)&local_3a0);
    uVar2 = uVar2 + 1;
  }
  GetReference(&local_380,__return_storage_ptr__,&local_3b8,(DescriptorNode *)0x0);
  DescriptorScriptReference::~DescriptorScriptReference(&local_380);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_3b8);
  return __return_storage_ptr__;
}

Assistant:

DescriptorNode DescriptorNode::Parse(
    const std::string& output_descriptor,
    const std::vector<AddressFormatData>& network_parameters) {
  DescriptorNode node(network_parameters);
  node.node_type_ = DescriptorNodeType::kDescriptorTypeScript;
  node.AnalyzeChild(output_descriptor, 0);
  node.AnalyzeAll("");
  // Script generate test
  std::vector<std::string> list;
  for (uint32_t index = 0; index < node.GetNeedArgumentNum(); ++index) {
    list.push_back("0");
  }
  node.GetReference(&list);
  return node;
}